

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inverse.h
# Opt level: O0

void Eigen::internal::
     compute_inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *matrix,Matrix<double,__1,__1,_0,__1,__1> *result)

{
  PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_80;
  solve_retval<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_38;
  Matrix<double,_1,_1,0,_1,_1> *local_18;
  Matrix<double,__1,__1,_0,__1,__1> *result_local;
  Matrix<double,__1,__1,_0,__1,__1> *matrix_local;
  
  local_18 = (Matrix<double,_1,_1,0,_1,_1> *)result;
  result_local = matrix;
  MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::partialPivLu
            (&local_80,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)matrix);
  PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse(&local_38,&local_80);
  Matrix<double,-1,-1,0,-1,-1>::operator=
            (local_18,(ReturnByValue<Eigen::internal::solve_retval_base<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                       *)&local_38);
  PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~PartialPivLU(&local_80);
  return;
}

Assistant:

static inline void run(const MatrixType& matrix, ResultType& result)
  {
    result = matrix.partialPivLu().inverse();
  }